

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphAdjacencyList.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (int *__result,int *__a,int *__b,int *__c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 uVar4;
  
  iVar1 = *__a;
  iVar2 = *__b;
  iVar3 = *__c;
  if (iVar1 < iVar2) {
    if (iVar2 < iVar3) {
      iVar1 = *__result;
      uVar4 = (undefined1)__result[1];
      *__result = *__b;
      *(char *)(__result + 1) = (char)__b[1];
      *__b = iVar1;
      __c = __b;
    }
    else {
      iVar2 = *__result;
      uVar4 = (undefined1)__result[1];
      if (iVar1 < iVar3) {
        *(char *)(__result + 1) = (char)__c[1];
        *__result = *__c;
        *__c = iVar2;
      }
      else {
        *(char *)(__result + 1) = (char)__a[1];
        *__result = *__a;
        *__a = iVar2;
        __c = __a;
      }
    }
  }
  else if (iVar1 < iVar3) {
    iVar1 = *__result;
    uVar4 = (undefined1)__result[1];
    *__result = *__a;
    *(char *)(__result + 1) = (char)__a[1];
    *__a = iVar1;
    __c = __a;
  }
  else {
    iVar1 = *__result;
    uVar4 = (undefined1)__result[1];
    if (iVar2 < iVar3) {
      *(char *)(__result + 1) = (char)__c[1];
      *__result = *__c;
      *__c = iVar1;
    }
    else {
      *(char *)(__result + 1) = (char)__b[1];
      *__result = *__b;
      *__b = iVar1;
      __c = __b;
    }
  }
  *(undefined1 *)(__c + 1) = uVar4;
  return;
}

Assistant:

cmGraphEdge(cmGraphEdge const& r): Dest(r.Dest), Strong(r.Strong) {}